

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O3

ggml_type kv_cache_type_from_str(string *s)

{
  pointer pgVar1;
  int iVar2;
  runtime_error *this;
  pointer pgVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pgVar1 = kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pgVar3 = kv_cache_types.super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pgVar3 == pgVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_40,"Unsupported cache type: ",s);
      std::runtime_error::runtime_error(this,(string *)&local_40);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ggml_type_name(*pgVar3);
    iVar2 = std::__cxx11::string::compare((char *)s);
    if (iVar2 == 0) break;
    pgVar3 = pgVar3 + 1;
  }
  return *pgVar3;
}

Assistant:

static ggml_type kv_cache_type_from_str(const std::string & s) {
    for (const auto & type : kv_cache_types) {
        if (ggml_type_name(type) == s) {
            return type;
        }
    }
    throw std::runtime_error("Unsupported cache type: " + s);
}